

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

ENetSocket connectmaster(bool wait)

{
  int iVar1;
  ENetSocket socket;
  char *fmt;
  
  if (*mastername != '\0') {
    if (masteraddress.host == 0) {
      logoutf("looking up %s...");
      masteraddress.port = (enet_uint16)masterport;
      iVar1 = enet_address_set_host(&masteraddress,mastername);
      if (iVar1 < 0) {
        return -1;
      }
    }
    socket = enet_socket_create(ENET_SOCKET_TYPE_STREAM);
    if (socket == -1) {
      fmt = "could not open master server socket";
    }
    else {
      if (((wait) || (serveraddress.host == 0)) ||
         (iVar1 = enet_socket_bind(socket,&serveraddress), iVar1 == 0)) {
        enet_socket_set_option(socket,ENET_SOCKOPT_NONBLOCK,1);
        iVar1 = enet_socket_connect(socket,&masteraddress);
        if (iVar1 == 0) {
          return socket;
        }
      }
      enet_socket_destroy(socket);
      fmt = "could not connect to master server";
    }
    logoutf(fmt);
  }
  return -1;
}

Assistant:

ENetSocket connectmaster(bool wait)
{
    if(!mastername[0]) return ENET_SOCKET_NULL;
    if(masteraddress.host == ENET_HOST_ANY)
    {
        logoutf("looking up %s...", mastername);
        masteraddress.port = masterport;
        if(!resolverwait(mastername, &masteraddress)) return ENET_SOCKET_NULL;
    }
    ENetSocket sock = enet_socket_create(ENET_SOCKET_TYPE_STREAM);
    if(sock == ENET_SOCKET_NULL)
    {
        logoutf("could not open master server socket");
        return ENET_SOCKET_NULL;
    }
    if(wait || serveraddress.host == ENET_HOST_ANY || !enet_socket_bind(sock, &serveraddress))
    {
        enet_socket_set_option(sock, ENET_SOCKOPT_NONBLOCK, 1);
        if(wait)
        {
            if(!connectwithtimeout(sock, mastername, masteraddress)) return sock;
        }
        else if(!enet_socket_connect(sock, &masteraddress)) return sock;
    }
    enet_socket_destroy(sock);
    logoutf("could not connect to master server");
    return ENET_SOCKET_NULL;
}